

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_txfm_sse4.h
# Opt level: O0

void av1_round_shift_rect_array_32_sse4_1(__m128i *input,__m128i *output,int size,int bit,int val)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 *puVar6;
  uint in_ECX;
  int in_EDX;
  ulong uVar7;
  long in_RSI;
  long lVar8;
  long in_RDI;
  uint in_R8D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  __m128i alVar9;
  __m128i vec;
  __m128i vec_00;
  __m128i r1_1;
  __m128i r0_1;
  int i_1;
  __m128i r1;
  __m128i r0;
  int i;
  __m128i sqrt2;
  int local_fc;
  int local_cc;
  int local_88;
  undefined4 uStack_84;
  
  uVar7 = (ulong)in_R8D;
  if ((int)in_ECX < 1) {
    lVar8 = in_RSI;
    for (local_fc = 0; local_fc < in_EDX; local_fc = local_fc + 1) {
      puVar6 = (undefined8 *)(in_RDI + (long)local_fc * 0x10);
      uVar1 = *puVar6;
      local_88 = (int)uVar1;
      uStack_84 = (undefined4)((ulong)uVar1 >> 0x20);
      auVar2._4_4_ = uStack_84;
      auVar2._0_4_ = local_88 << -in_ECX;
      auVar3._8_8_ = CONCAT44(in_R8D,in_R8D);
      auVar3._0_8_ = CONCAT44(in_R8D,in_R8D);
      auVar2._8_8_ = puVar6[1];
      pmulld(auVar3,auVar2);
      alVar9[1] = lVar8;
      alVar9[0] = 0xc;
      alVar9 = av1_round_shift_32_sse4_1(alVar9,(int)uVar7);
      uVar7 = alVar9[1];
      puVar6 = (undefined8 *)(in_RSI + (long)local_fc * 0x10);
      *puVar6 = extraout_XMM0_Qa_01;
      puVar6[1] = extraout_XMM0_Qb_01;
    }
  }
  else {
    lVar8 = in_RSI;
    for (local_cc = 0; local_cc < in_EDX; local_cc = local_cc + 1) {
      vec[0] = (ulong)in_ECX;
      vec[1] = lVar8;
      alVar9 = av1_round_shift_32_sse4_1(vec,(int)uVar7);
      auVar5._8_8_ = CONCAT44(in_R8D,in_R8D);
      auVar5._0_8_ = CONCAT44(in_R8D,in_R8D);
      auVar4._8_8_ = extraout_XMM0_Qb;
      auVar4._0_8_ = extraout_XMM0_Qa;
      pmulld(auVar5,auVar4);
      vec_00[1] = lVar8;
      vec_00[0] = 0xc;
      alVar9 = av1_round_shift_32_sse4_1(vec_00,(int)alVar9[1]);
      uVar7 = alVar9[1];
      puVar6 = (undefined8 *)(in_RSI + (long)local_cc * 0x10);
      *puVar6 = extraout_XMM0_Qa_00;
      puVar6[1] = extraout_XMM0_Qb_00;
    }
  }
  return;
}

Assistant:

static inline void av1_round_shift_rect_array_32_sse4_1(const __m128i *input,
                                                        __m128i *output,
                                                        const int size,
                                                        const int bit,
                                                        const int val) {
  const __m128i sqrt2 = _mm_set1_epi32(val);
  if (bit > 0) {
    int i;
    for (i = 0; i < size; i++) {
      const __m128i r0 = av1_round_shift_32_sse4_1(input[i], bit);
      const __m128i r1 = _mm_mullo_epi32(sqrt2, r0);
      output[i] = av1_round_shift_32_sse4_1(r1, NewSqrt2Bits);
    }
  } else {
    int i;
    for (i = 0; i < size; i++) {
      const __m128i r0 = _mm_slli_epi32(input[i], -bit);
      const __m128i r1 = _mm_mullo_epi32(sqrt2, r0);
      output[i] = av1_round_shift_32_sse4_1(r1, NewSqrt2Bits);
    }
  }
}